

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O0

FString __thiscall FScanner::TokenName(FScanner *this,int token,char *string)

{
  char tail;
  char quote;
  FString local_30;
  FString local_28;
  FString work;
  char *string_local;
  int token_local;
  FString *work_1;
  
  work.Chars = string;
  FString::FString(&local_28);
  if ((token < 0x21) || (0xff < token)) {
    if ((token < 0x101) || (399 < token)) {
      FString::FString((FString *)this);
      FString::Format((FString *)this,"Unknown(%d)",(ulong)(uint)token);
      goto LAB_006593f0;
    }
    FString::operator=(&local_28,TokenName::names[token + -0x101]);
    if (((work.Chars != (char *)0x0) && (0x100 < token)) && (token < 0x107)) {
      FString::operator+=(&local_28,' ');
      tail = (token != 0x102) * '\x05' + '\"';
      FString::operator+=(&local_28,tail);
      FString::operator+=(&local_28,work.Chars);
      FString::operator+=(&local_28,tail);
    }
  }
  else {
    FString::FString(&local_30,'\'');
    FString::operator=(&local_28,&local_30);
    FString::~FString(&local_30);
    string_local._4_1_ = (char)token;
    FString::operator+=(&local_28,string_local._4_1_);
    FString::operator+=(&local_28,'\'');
  }
  FString::FString((FString *)this,&local_28);
LAB_006593f0:
  FString::~FString(&local_28);
  return (FString)(char *)this;
}

Assistant:

FString FScanner::TokenName (int token, const char *string)
{
	static const char *const names[] =
	{
#define xx(sym,str)		str,
#include "sc_man_tokens.h"
	};

	FString work;

	if (token > ' ' && token < 256)
	{
		work = '\'';
		work += token;
		work += '\'';
	}
	else if (token >= TK_Identifier && token < TK_LastToken)
	{
		work = names[token - TK_Identifier];
		if (string != NULL && token >= TK_Identifier && token <= TK_FloatConst)
		{
			work += ' ';
			char quote = (token == TK_StringConst) ? '"' : '\'';
			work += quote;
			work += string;
			work += quote;
		}
	}
	else
	{
		FString work;
		work.Format ("Unknown(%d)", token);
		return work;
	}
	return work;
}